

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::IsFieldDependent(FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  Descriptor *pDVar3;
  long lVar4;
  long lVar5;
  
  if ((*(long *)(field + 0x60) != 0) &&
     (TVar2 = FieldDescriptor::type(field),
     *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) == 9)) {
    return true;
  }
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    pDVar3 = FieldDescriptor::message_type(field);
    bVar1 = 0 < *(int *)(pDVar3 + 0x2c);
    if (0 < *(int *)(pDVar3 + 0x2c)) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        bVar1 = IsFieldDependent((FieldDescriptor *)(*(long *)(pDVar3 + 0x30) + lVar4));
        if (bVar1) {
          return true;
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0xa8;
        bVar1 = lVar5 < *(int *)(pDVar3 + 0x2c);
      } while (lVar5 < *(int *)(pDVar3 + 0x2c));
    }
  }
  else {
    TVar2 = FieldDescriptor::type(field);
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) == 10) {
      bVar1 = true;
      if (*(long *)(field + 0x60) == 0) {
        lVar4 = *(long *)(field + 0x30);
        pDVar3 = FieldDescriptor::message_type(field);
        bVar1 = lVar4 != *(long *)(pDVar3 + 0x10);
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool IsFieldDependent(const FieldDescriptor* field) {
  if (field->containing_oneof() != NULL &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    return true;
  }
  if (field->is_map()) {
    const Descriptor* map_descriptor = field->message_type();
    for (int i = 0; i < map_descriptor->field_count(); i++) {
      if (IsFieldDependent(map_descriptor->field(i))) {
        return true;
      }
    }
    return false;
  }
  if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    return false;
  }
  if (field->containing_oneof() != NULL) {
    // Oneof fields will always be dependent.
    //
    // This is a unique case for field codegen. Field generators are
    // responsible for generating all the field-specific accessor
    // functions, except for the clear_*() function; instead, field
    // generators produce inline clearing code.
    //
    // For non-oneof fields, the Message class uses the inline clearing
    // code to define the field's clear_*() function, as well as in the
    // destructor. For oneof fields, the Message class generates a much
    // more complicated clear_*() function, which clears only the oneof
    // member that is set, in addition to clearing methods for each of the
    // oneof members individually.
    //
    // Since oneofs do not have their own generator class, the Message code
    // generation logic would be significantly complicated in order to
    // split dependent and non-dependent manipulation logic based on
    // whether the oneof truly needs to be dependent; so, for oneof fields,
    // we just assume it (and its constituents) should be manipulated by a
    // dependent base class function.
    //
    // This is less precise than how dependent message-typed fields are
    // handled, but the cost is limited to only the generated code for the
    // oneof field, which seems like an acceptable tradeoff.
    return true;
  }
  if (field->file() == field->message_type()->file()) {
    return false;
  }
  return true;
}